

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

record_info_s * record_info_for_database(record_info_s *__return_storage_ptr__,MMDB_s *mmdb)

{
  record_info_s *record_info;
  MMDB_s *mmdb_local;
  
  memset(__return_storage_ptr__,0,0x20);
  __return_storage_ptr__->record_length = mmdb->full_record_byte_size;
  if (__return_storage_ptr__->record_length == 6) {
    __return_storage_ptr__->left_record_getter = get_uint24;
    __return_storage_ptr__->right_record_getter = get_uint24;
    __return_storage_ptr__->right_record_offset = '\x03';
  }
  else if (__return_storage_ptr__->record_length == 7) {
    __return_storage_ptr__->left_record_getter = get_left_28_bit_record;
    __return_storage_ptr__->right_record_getter = get_right_28_bit_record;
    __return_storage_ptr__->right_record_offset = '\x03';
  }
  else if (__return_storage_ptr__->record_length == 8) {
    __return_storage_ptr__->left_record_getter = get_uint32;
    __return_storage_ptr__->right_record_getter = get_uint32;
    __return_storage_ptr__->right_record_offset = '\x04';
  }
  return __return_storage_ptr__;
}

Assistant:

static record_info_s record_info_for_database(const MMDB_s *const mmdb) {
    record_info_s record_info = {.record_length = mmdb->full_record_byte_size,
                                 .right_record_offset = 0};

    if (record_info.record_length == 6) {
        record_info.left_record_getter = &get_uint24;
        record_info.right_record_getter = &get_uint24;
        record_info.right_record_offset = 3;
    } else if (record_info.record_length == 7) {
        record_info.left_record_getter = &get_left_28_bit_record;
        record_info.right_record_getter = &get_right_28_bit_record;
        record_info.right_record_offset = 3;
    } else if (record_info.record_length == 8) {
        record_info.left_record_getter = &get_uint32;
        record_info.right_record_getter = &get_uint32;
        record_info.right_record_offset = 4;
    }

    // Callers must check that right_record_offset is non-zero in case none of
    // the above conditions matched.

    return record_info;
}